

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

int __thiscall Matrix::nSize(Matrix *this,int n)

{
  ostream *poVar1;
  int n_local;
  Matrix *this_local;
  
  if (n < this->nMatrixDimension) {
    this_local._4_4_ = this->pSize[n];
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Matrix::nSize(int): int (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    poVar1 = std::operator<<(poVar1,") larger than number of dimensions.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int Matrix::nSize(int n)
{
	if( n>=nMatrixDimension ) {
		cout << "Matrix::nSize(int): int ("
			<< n
			<< ") larger than number of dimensions." << endl;
		return -1;
	}
	return pSize[n];
}